

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__stream_flush_write_queue(uv_stream_t *stream,int error)

{
  undefined8 *puVar1;
  long *plVar2;
  
  plVar2 = (long *)stream->write_queue[0];
  if (stream->write_queue != (void **)plVar2) {
    do {
      *(long *)plVar2[1] = *plVar2;
      *(long *)(*plVar2 + 8) = plVar2[1];
      *(int *)((long)plVar2 + 0x24) = error;
      *plVar2 = (long)stream->write_completed_queue;
      puVar1 = (undefined8 *)stream->write_completed_queue[1];
      plVar2[1] = (long)puVar1;
      *puVar1 = plVar2;
      stream->write_completed_queue[1] = plVar2;
      plVar2 = (long *)stream->write_queue[0];
    } while (stream->write_queue != (void **)plVar2);
  }
  return;
}

Assistant:

void uv__stream_flush_write_queue(uv_stream_t* stream, int error) {
  uv_write_t* req;
  QUEUE* q;
  while (!QUEUE_EMPTY(&stream->write_queue)) {
    q = QUEUE_HEAD(&stream->write_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_write_t, queue);
    req->error = error;

    QUEUE_INSERT_TAIL(&stream->write_completed_queue, &req->queue);
  }
}